

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

void nni_aio_init(nni_aio *aio,nni_cb cb,void *arg)

{
  nni_aio_expire_q **ppnVar1;
  uint32_t uVar2;
  void *arg_local;
  nni_cb cb_local;
  nni_aio *aio_local;
  
  memset(aio,0,0x1c8);
  nni_task_init(&aio->a_task,(nni_taskq *)0x0,cb,arg);
  aio->a_expire = 0xffffffffffffffff;
  aio->a_timeout = -1;
  aio->a_init = true;
  ppnVar1 = nni_aio_expire_q_list;
  uVar2 = nni_random();
  aio->a_expire_q = ppnVar1[(ulong)uVar2 % (ulong)(uint)nni_aio_expire_q_cnt];
  return;
}

Assistant:

void
nni_aio_init(nni_aio *aio, nni_cb cb, void *arg)
{
	memset(aio, 0, sizeof(*aio));
	nni_task_init(&aio->a_task, NULL, cb, arg);
	aio->a_expire  = NNI_TIME_NEVER;
	aio->a_timeout = NNG_DURATION_INFINITE;
	aio->a_init    = true;
	aio->a_expire_q =
	    nni_aio_expire_q_list[nni_random() % nni_aio_expire_q_cnt];
}